

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O1

int __thiscall Darts::Details::DawgBuilder::init(DawgBuilder *this,EVP_PKEY_CTX *ctx)

{
  size_t *psVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  int extraout_EAX;
  ulong uVar5;
  uint local_10 [2];
  
  local_10[1] = 0;
  AutoPool<unsigned_int>::resize(&this->table_,0x400,local_10 + 1);
  sVar3 = (this->recycle_bin_).pool_.size_;
  if (sVar3 == 0) {
    AutoPool<Darts::Details::DawgNode>::append(&this->nodes_);
  }
  else {
    pcVar4 = (this->nodes_).buf_.array_;
    uVar5 = (ulong)*(uint *)((this->recycle_bin_).pool_.buf_.array_ + sVar3 * 4 + -4);
    pcVar2 = pcVar4 + uVar5 * 0xc + 7;
    pcVar2[0] = '\0';
    pcVar2[1] = '\0';
    pcVar2[2] = '\0';
    pcVar2[3] = '\0';
    pcVar4 = pcVar4 + uVar5 * 0xc;
    pcVar4[0] = '\0';
    pcVar4[1] = '\0';
    pcVar4[2] = '\0';
    pcVar4[3] = '\0';
    pcVar4[4] = '\0';
    pcVar4[5] = '\0';
    pcVar4[6] = '\0';
    pcVar4[7] = '\0';
    psVar1 = &(this->recycle_bin_).pool_.size_;
    *psVar1 = *psVar1 - 1;
  }
  BitVector::append(&this->is_intersections_);
  AutoPool<Darts::Details::DawgUnit>::append(&this->units_);
  sVar3 = (this->labels_).size_;
  if (sVar3 == (this->labels_).capacity_) {
    AutoPool<unsigned_char>::resize_buf(&this->labels_,sVar3 + 1);
  }
  psVar1 = &(this->labels_).size_;
  *psVar1 = *psVar1 + 1;
  this->num_states_ = 1;
  (this->nodes_).buf_.array_[8] = -1;
  local_10[0] = 0;
  AutoPool<unsigned_int>::append(&(this->node_stack_).pool_,local_10);
  return extraout_EAX;
}

Assistant:

inline void DawgBuilder::init() {
  table_.resize(INITIAL_TABLE_SIZE, 0);

  append_node();
  append_unit();

  num_states_ = 1;

  nodes_[0].set_label(0xFF);
  node_stack_.push(0);
}